

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateAutoRefFunctionSet(ExpressionContext *ctx,SynBase *source,ExprBase *value,InplaceStr name)

{
  FunctionData *pFVar1;
  long lVar2;
  TypeFunction *pTVar3;
  uint uVar4;
  int iVar5;
  TypeBase *pTVar6;
  undefined4 extraout_var;
  TypeFunctionSet *pTVar8;
  ExprBase *pEVar9;
  ulong uVar10;
  ulong uVar11;
  ArrayView<TypeBase_*> setTypes;
  IntrusiveList<FunctionHandle> functions;
  SmallArray<TypeBase_*,_16U> types;
  IntrusiveList<FunctionHandle> local_d8;
  SmallArray<TypeBase_*,_16U> local_c8;
  FunctionHandle *pFVar7;
  undefined4 extraout_var_00;
  
  local_c8.allocator = ctx->allocator;
  local_c8.data = local_c8.little;
  local_c8.count = 0;
  local_c8.max = 0x10;
  local_d8.head = (FunctionHandle *)0x0;
  local_d8.tail = (FunctionHandle *)0x0;
  if ((ctx->functions).count != 0) {
    uVar11 = 0;
    do {
      pFVar1 = (ctx->functions).data[uVar11];
      pTVar6 = pFVar1->scope->ownerType;
      if (pTVar6 != (TypeBase *)0x0) {
        uVar4 = NULLC::StringHashContinue(pTVar6->nameHash,"::");
        uVar4 = NULLC::StringHashContinue(uVar4,name.begin,name.end);
        if ((pFVar1->nameHash == uVar4) && ((pFVar1->generics).head == (MatchData *)0x0)) {
          pTVar6 = pFVar1->scope->ownerType;
          if (pTVar6->isGeneric == true) {
            if ((pTVar6 == (TypeBase *)0x0) || (pTVar6->typeID != 0x16)) {
              pTVar6 = (TypeBase *)0x0;
            }
            if ((pTVar6 != (TypeBase *)0x0) &&
               (lVar2._0_4_ = pTVar6[2].typeID, lVar2._4_4_ = pTVar6[2].nameHash, lVar2 == 0))
            goto LAB_0015efb1;
          }
          pTVar3 = pFVar1->type;
          pFVar7 = local_d8.head;
          if (local_d8.head != (FunctionHandle *)0x0 && (pTVar3->super_TypeBase).isGeneric == false)
          {
            do {
              if (pFVar7->function->type == pTVar3) goto LAB_0015efb1;
              pFVar7 = pFVar7->next;
            } while (pFVar7 != (FunctionHandle *)0x0);
          }
          if (local_c8.count == local_c8.max) {
            SmallArray<TypeBase_*,_16U>::grow(&local_c8,local_c8.count);
          }
          if (local_c8.data == (TypeBase **)0x0) {
            __assert_fail("data",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x162,
                          "void SmallArray<TypeBase *, 16>::push_back(const T &) [T = TypeBase *, N = 16]"
                         );
          }
          uVar10 = (ulong)local_c8.count;
          local_c8.count = local_c8.count + 1;
          local_c8.data[uVar10] = &pTVar3->super_TypeBase;
          iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
          pFVar7 = (FunctionHandle *)CONCAT44(extraout_var,iVar5);
          pFVar7->function = pFVar1;
          pFVar7->next = (FunctionHandle *)0x0;
          pFVar7->listed = false;
          IntrusiveList<FunctionHandle>::push_back(&local_d8,pFVar7);
        }
      }
LAB_0015efb1:
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ctx->functions).count);
  }
  if (local_d8.head == (FunctionHandle *)0x0) {
    if ((TypeStruct *)value->type == ctx->typeAutoRef) {
      anon_unknown.dwarf_9fd58::Stop
                (ctx,source,"ERROR: function \'%.*s\' is undefined in any of existing classes",
                 (ulong)(uint)((int)name.end - (int)name.begin),name.begin);
    }
    pEVar9 = (ExprBase *)0x0;
  }
  else {
    setTypes.count = local_c8.count;
    setTypes.data = local_c8.data;
    setTypes._12_4_ = 0;
    pTVar8 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar9 = (ExprBase *)CONCAT44(extraout_var_00,iVar5);
    pEVar9->typeID = 0x27;
    pEVar9->source = source;
    pEVar9->type = &pTVar8->super_TypeBase;
    pEVar9->next = (ExprBase *)0x0;
    pEVar9->listed = false;
    pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229e80;
    pEVar9[1]._vptr_ExprBase = (_func_int **)local_d8.head;
    *(FunctionHandle **)&pEVar9[1].typeID = local_d8.tail;
    pEVar9[1].source = (SynBase *)value;
  }
  SmallArray<TypeBase_*,_16U>::~SmallArray(&local_c8);
  return pEVar9;
}

Assistant:

ExprBase* CreateAutoRefFunctionSet(ExpressionContext &ctx, SynBase *source, ExprBase *value, InplaceStr name)
{
	SmallArray<TypeBase*, 16> types(ctx.allocator);
	IntrusiveList<FunctionHandle> functions;

	// Find all member functions with the specified name
	for(unsigned i = 0; i < ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.functions[i];

		TypeBase *parentType = function->scope->ownerType;

		if(!parentType)
			continue;

		unsigned hash = NULLC::StringHashContinue(parentType->nameHash, "::");

		hash = NULLC::StringHashContinue(hash, name.begin, name.end);

		if(function->nameHash != hash)
			continue;

		// Can't specify generic function arguments for call through 'auto ref'
		if(!function->generics.empty())
			continue;

		// Ignore generic types if they don't have a single instance
		if(function->scope->ownerType->isGeneric)
		{
			if(TypeGenericClassProto *proto = getType<TypeGenericClassProto>(function->scope->ownerType))
			{
				if(proto->instances.empty())
					continue;
			}
		}

		FunctionHandle *prev = NULL;

		// Pointer to generic types don't stricly match because they might be resolved to different types
		if (!function->type->isGeneric)
		{
			for(FunctionHandle *curr = functions.head; curr; curr = curr->next)
			{
				if(curr->function->type == function->type)
				{
					prev = curr;
					break;
				}
			}
		}

		if(prev)
			continue;

		types.push_back(function->type);
		functions.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(function));
	}

	if(functions.empty())
	{
		if(value->type != ctx.typeAutoRef)
			return NULL;

		Stop(ctx, source, "ERROR: function '%.*s' is undefined in any of existing classes", FMT_ISTR(name));
	}

	TypeFunctionSet *type = ctx.GetFunctionSetType(types);

	return new (ctx.get<ExprFunctionOverloadSet>()) ExprFunctionOverloadSet(source, type, functions, value);
}